

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

void despot::DESPOT::Expand
               (QNode *qnode,ScenarioLowerBound *lb,ScenarioUpperBound *ub,DSPOMDP *model,
               RandomStreams *streams,History *history)

{
  pointer *ppiVar1;
  pointer *ppuVar2;
  pointer ppSVar3;
  State *pSVar4;
  QNode *this;
  int iVar5;
  uint uVar6;
  int iVar7;
  VNode *pVVar8;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar9;
  log_ostream *plVar10;
  ostream *poVar11;
  undefined4 extraout_var;
  mapped_type *pmVar12;
  mapped_type *ppVVar13;
  _Base_ptr p_Var14;
  _Self __tmp;
  int i;
  ulong uVar15;
  double dVar16;
  State *copy;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  State *local_d0;
  double local_c8;
  double local_c0;
  History *local_b8;
  double local_b0;
  VNode *local_a8;
  QNode *local_a0;
  RandomStreams *local_98;
  double local_90;
  ScenarioLowerBound *local_88;
  ScenarioUpperBound *local_80;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_78;
  double local_70;
  key_type local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  local_60;
  
  local_b8 = history;
  local_88 = lb;
  local_80 = ub;
  pVVar8 = QNode::parent(qnode);
  iVar5 = VNode::depth(pVVar8);
  local_98 = streams;
  RandomStreams::position(streams,iVar5);
  local_a0 = qnode;
  local_78 = QNode::children(qnode);
  local_a8 = pVVar8;
  pvVar9 = VNode::particles(pVVar8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = 0.0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar15 = 0;
      ppSVar3 = (pvVar9->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(pvVar9->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3);
      uVar15 = uVar15 + 1) {
    pSVar4 = ppSVar3[uVar15];
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (3 < iVar5) {
        plVar10 = logging::stream(4);
        poVar11 = std::operator<<(&plVar10->super_ostream," Original: ");
        poVar11 = despot::operator<<(poVar11,pSVar4);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    iVar5 = (*model->_vptr_DSPOMDP[0x16])(model,pSVar4);
    local_d0 = (State *)CONCAT44(extraout_var,iVar5);
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (3 < iVar5) {
        plVar10 = logging::stream(4);
        poVar11 = std::operator<<(&plVar10->super_ostream," Before step: ");
        poVar11 = despot::operator<<(poVar11,local_d0);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    pSVar4 = local_d0;
    local_c0 = RandomStreams::Entry(local_98,local_d0->scenario_id);
    uVar6 = QNode::edge(local_a0);
    iVar5 = (*model->_vptr_DSPOMDP[2])(local_c0,model,pSVar4,(ulong)uVar6,&local_b0,&local_68);
    local_c0 = local_b0 * local_d0->weight;
    iVar7 = logging::level();
    if (0 < iVar7) {
      iVar7 = logging::level();
      if (3 < iVar7) {
        plVar10 = logging::stream(4);
        poVar11 = std::operator<<(&plVar10->super_ostream," After step: ");
        poVar11 = despot::operator<<(poVar11,local_d0);
        std::operator<<(poVar11," ");
        poVar11 = std::ostream::_M_insert<double>(local_b0 * local_d0->weight);
        std::operator<<(poVar11," ");
        poVar11 = std::ostream::_M_insert<double>(local_b0);
        std::operator<<(poVar11," ");
        poVar11 = std::ostream::_M_insert<double>(local_d0->weight);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    if ((char)iVar5 == '\0') {
      pmVar12 = std::
                map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                              *)&local_60,&local_68);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back(pmVar12,&local_d0);
    }
    else {
      (*model->_vptr_DSPOMDP[0x17])(model,local_d0);
    }
    local_c8 = local_c8 + local_c0;
  }
  iVar5 = VNode::depth(local_a8);
  dVar16 = pow(DAT_0019fdd8,(double)iVar5);
  this = local_a0;
  local_c8 = dVar16 * local_c8 - DAT_0019fde0;
  local_c0 = local_c8;
  local_90 = local_c8;
  for (p_Var14 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != &local_60._M_impl.super__Rb_tree_header;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    local_d0 = *(State **)(p_Var14 + 1);
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (3 < iVar5) {
        plVar10 = logging::stream(4);
        poVar11 = std::operator<<(&plVar10->super_ostream," Creating node for obs ");
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    pVVar8 = (VNode *)operator_new(0x98);
    pmVar12 = std::
              map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
              ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                            *)&local_60,(key_type *)&local_d0);
    iVar5 = VNode::depth(local_a8);
    VNode::VNode(pVVar8,pmVar12,iVar5 + 1,this,(OBS_TYPE)local_d0);
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (3 < iVar5) {
        plVar10 = logging::stream(4);
        poVar11 = std::operator<<(&plVar10->super_ostream," New node created!");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    ppVVar13 = std::
               map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
               ::operator[](local_78,(key_type *)&local_d0);
    *ppVVar13 = pVVar8;
    iVar5 = QNode::edge(this);
    History::Add(local_b8,iVar5,(OBS_TYPE)local_d0);
    InitBounds(pVVar8,local_88,local_80,local_98,local_b8);
    ppiVar1 = &(local_b8->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
    ppuVar2 = &(local_b8->observations_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar2 = *ppuVar2 + -1;
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (3 < iVar5) {
        plVar10 = logging::stream(4);
        std::operator<<(&plVar10->super_ostream," New node\'s bounds: (");
        dVar16 = VNode::lower_bound(pVVar8);
        poVar11 = std::ostream::_M_insert<double>(dVar16);
        std::operator<<(poVar11,", ");
        dVar16 = VNode::upper_bound(pVVar8);
        poVar11 = std::ostream::_M_insert<double>(dVar16);
        poVar11 = std::operator<<(poVar11,")");
        std::endl<char,std::char_traits<char>>(poVar11);
      }
    }
    local_70 = VNode::lower_bound(pVVar8);
    dVar16 = VNode::upper_bound(pVVar8);
    local_c0 = local_c0 + local_70;
    local_c8 = local_c8 + dVar16;
  }
  this->step_reward = local_90;
  QNode::lower_bound(this,local_c0);
  QNode::upper_bound(this,local_c8);
  this->utility_upper_bound = local_c8 + DAT_0019fde0;
  this->default_value = local_c0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DESPOT::Expand(QNode* qnode, ScenarioLowerBound* lb,
	ScenarioUpperBound* ub, const DSPOMDP* model,
	RandomStreams& streams,
	History& history) {
	VNode* parent = qnode->parent();
	streams.position(parent->depth());
	map<OBS_TYPE, VNode*>& children = qnode->children();

	const vector<State*>& particles = parent->particles();

	double step_reward = 0;

	// Partition particles by observation
	map<OBS_TYPE, vector<State*> > partitions;
	OBS_TYPE obs;
	double reward;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		logd << " Original: " << *particle << endl;

		State* copy = model->Copy(particle);

		logd << " Before step: " << *copy << endl;

		bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
			qnode->edge(), reward, obs);

		step_reward += reward * copy->weight;

		logd << " After step: " << *copy << " " << (reward * copy->weight)
			<< " " << reward << " " << copy->weight << endl;

		if (!terminal) {
			partitions[obs].push_back(copy);
		} else {
			model->Free(copy);
		}
	}
	step_reward = Globals::Discount(parent->depth()) * step_reward
		- Globals::config.pruning_constant;//pruning_constant is used for regularization

	double lower_bound = step_reward;
	double upper_bound = step_reward;

	// Create new belief nodes
	for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
		it != partitions.end(); it++) {
		OBS_TYPE obs = it->first;
		logd << " Creating node for obs " << obs << endl;
		VNode* vnode = new VNode(partitions[obs], parent->depth() + 1,
			qnode, obs);
		logd << " New node created!" << endl;
		children[obs] = vnode;

		history.Add(qnode->edge(), obs);
		InitBounds(vnode, lb, ub, streams, history);
		history.RemoveLast();
		logd << " New node's bounds: (" << vnode->lower_bound() << ", "
			<< vnode->upper_bound() << ")" << endl;

		lower_bound += vnode->lower_bound();
		upper_bound += vnode->upper_bound();
	}

	qnode->step_reward = step_reward;
	qnode->lower_bound(lower_bound);
	qnode->upper_bound(upper_bound);
	qnode->utility_upper_bound = upper_bound + Globals::config.pruning_constant;

	qnode->default_value = lower_bound; // for debugging
}